

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v8::detail::write_int_noinline<char,fmt::v8::appender,unsigned_int>
                   (appender out,write_int_arg<unsigned_int> arg,basic_format_specs<char> *specs,
                   locale_ref loc)

{
  presentation_type pVar1;
  size_t sVar2;
  bool bVar3;
  uint uVar4;
  char *digits_1;
  appender aVar5;
  long lVar6;
  byte *pbVar7;
  char *pcVar8;
  write_int_arg<unsigned_int> wVar9;
  char *pcVar10;
  char *pcVar11;
  int size;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  format_decimal_result<char_*> fVar18;
  char buffer [10];
  write_int_data<char> data;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_70;
  undefined1 local_68 [32];
  bool local_48;
  write_int_data<char> local_40;
  
  pVar1 = specs->type;
  local_70 = out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
  if (pVar1 < string) {
    uVar17 = (ulong)arg >> 0x20;
    uVar16 = arg.prefix;
    uVar14 = arg.abs_value;
    switch(pVar1) {
    case none:
    case dec:
      if (((specs->field_0xa & 1) != 0) &&
         (bVar3 = write_int_localized<fmt::v8::appender,unsigned_long,char>
                            ((appender *)&local_70,(ulong)arg & 0xffffffff,uVar16,specs,loc), bVar3)
         ) {
        return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)local_70.container;
      }
      out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
           (back_insert_iterator<fmt::v8::detail::buffer<char>_>)local_70.container;
      uVar13 = 0x1f;
      if ((uVar14 | 1) != 0) {
        for (; (uVar14 | 1) >> uVar13 == 0; uVar13 = uVar13 - 1) {
        }
      }
      uVar15 = ((ulong)arg & 0xffffffff) +
               *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar13 * 8);
      size = (int)(uVar15 >> 0x20);
      if (specs->precision != -1 || specs->width != 0) {
        write_int_data<char>::write_int_data(&local_40,size,uVar16,specs);
        local_68._8_8_ = local_40.size;
        local_68._16_8_ = local_40.padding;
        local_68._24_8_ = (ulong)arg & 0xffffffff | uVar15 & 0xffffffff00000000;
        local_68._0_4_ = uVar16;
        aVar5 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_int>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_1_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_int>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_1_)::_lambda(fmt::v8::appender)_1_&>
                          (out,specs,local_40.size,local_40.size,
                           (anon_class_32_3_03e05ccd *)local_68);
        return (appender)
               aVar5.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
      }
      if ((long)uVar15 < 0) {
        assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/fmt-src/include/fmt/core.h"
                    ,0x1aa,"negative value");
      }
      if ((uVar17 != 0) && (uVar16 = uVar16 & 0xffffff, ((ulong)arg & 0xffffff00000000) != 0)) {
        do {
          if (((buffer<char> *)
              out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)->capacity_ <
              ((buffer<char> *)
              out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)->size_ + 1)
          {
            (**((buffer<char> *)
               out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)->
               _vptr_buffer)(out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                             container);
          }
          sVar2 = ((buffer<char> *)
                  out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)->size_;
          ((buffer<char> *)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)
          ->size_ = sVar2 + 1;
          ((buffer<char> *)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)
          ->ptr_[sVar2] = (char)uVar16;
          bVar3 = 0xff < uVar16;
          uVar16 = uVar16 >> 8;
        } while (bVar3);
      }
      fVar18 = format_decimal<char,unsigned_int>(local_68,uVar14,size);
      pcVar10 = fVar18.end;
      break;
    case oct:
      uVar13 = 0x1f;
      if ((uVar14 | 1) != 0) {
        for (; (uVar14 | 1) >> uVar13 == 0; uVar13 = uVar13 - 1) {
        }
      }
      uVar15 = (ulong)uVar13;
      uVar13 = (int)(uVar15 * 0x55555556 >> 0x20) + 1;
      if (((specs->field_0x9 & 0x80) != 0) && (uVar14 != 0 && specs->precision <= (int)uVar13)) {
        uVar14 = 0x3000;
        if (uVar17 == 0) {
          uVar14 = 0x30;
        }
        uVar17 = (ulong)((uVar14 | uVar16) + 0x1000000);
      }
      uVar12 = (ulong)uVar13;
      uVar14 = (uint)uVar17;
      if (specs->precision != -1 || specs->width != 0) {
        write_int_data<char>::write_int_data(&local_40,uVar13,uVar14,specs);
        local_68._8_8_ = local_40.size;
        local_68._16_8_ = local_40.padding;
        local_68._24_8_ = (ulong)arg & 0xffffffff | uVar12 << 0x20;
        local_68._0_4_ = uVar14;
        aVar5 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_int>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_4_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_int>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_4_)::_lambda(fmt::v8::appender)_1_&>
                          (out,specs,local_40.size,local_40.size,
                           (anon_class_32_3_03e05ccd *)local_68);
        return (appender)
               aVar5.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
      }
      if ((uVar14 != 0) && (uVar14 = uVar14 & 0xffffff, (uVar17 & 0xffffff) != 0)) {
        do {
          if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                               container + 0x18) <
              *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                              container + 0x10) + 1U) {
            (*(code *)**(undefined8 **)
                        out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)
                      (out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
          }
          lVar6 = *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                  container + 0x10);
          *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                   0x10) = lVar6 + 1;
          *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                    container + 8) + lVar6) = (char)uVar14;
          bVar3 = 0xff < uVar14;
          uVar14 = uVar14 >> 8;
        } while (bVar3);
      }
      lVar6 = *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                              container + 0x10);
      uVar17 = lVar6 + uVar12;
      if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container
                    + 0x18) < uVar17) {
        lVar6 = 0;
      }
      else {
        *(ulong *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                  0x10) = uVar17;
        lVar6 = lVar6 + *(long *)((long)out.
                                        super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                        container + 8);
      }
      if (lVar6 != 0) {
        pbVar7 = (byte *)(lVar6 + uVar15 / 3);
        wVar9 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
        do {
          uVar14 = arg.abs_value;
          *pbVar7 = (byte)arg.abs_value & 7 | 0x30;
          wVar9 = (write_int_arg<unsigned_int>)((ulong)wVar9 >> 3);
          pbVar7 = pbVar7 + -1;
          arg = wVar9;
        } while (7 < uVar14);
        return (appender)
               out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
      }
      pcVar10 = local_68 + uVar12;
      pbVar7 = local_68 + uVar15 / 3;
      wVar9 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
      do {
        uVar14 = arg.abs_value;
        *pbVar7 = (byte)arg.abs_value & 7 | 0x30;
        wVar9 = (write_int_arg<unsigned_int>)((ulong)wVar9 >> 3);
        pbVar7 = pbVar7 + -1;
        arg = wVar9;
      } while (7 < uVar14);
      break;
    case hex_lower:
    case hex_upper:
      if ((specs->field_0x9 & 0x80) != 0) {
        uVar4 = (uint)(pVar1 != hex_upper) << 0xd | 0x5830;
        uVar13 = uVar4 << 8;
        if (uVar17 == 0) {
          uVar13 = uVar4;
        }
        uVar17 = (ulong)((uVar13 | uVar16) + 0x2000000);
      }
      uVar16 = 0x1f;
      if ((uVar14 | 1) != 0) {
        for (; (uVar14 | 1) >> uVar16 == 0; uVar16 = uVar16 - 1) {
        }
      }
      uVar14 = 8 - ((uVar16 ^ 0x1c) >> 2);
      uVar15 = (ulong)uVar14;
      uVar16 = (uint)uVar17;
      if (specs->precision != -1 || specs->width != 0) {
        write_int_data<char>::write_int_data(&local_40,uVar14,uVar16,specs);
        local_68._8_8_ = local_40.size;
        local_68._16_8_ = local_40.padding;
        local_68._24_8_ = (ulong)arg & 0xffffffff | uVar15 << 0x20;
        local_68._0_4_ = uVar16;
        local_48 = pVar1 == hex_upper;
        aVar5 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_int>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_2_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_int>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_2_)::_lambda(fmt::v8::appender)_1_&>
                          (out,specs,local_40.size,local_40.size,
                           (anon_class_40_3_03e05ccd *)local_68);
        return (appender)
               aVar5.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
      }
      if ((uVar16 != 0) && (uVar14 = uVar16 & 0xffffff, (uVar17 & 0xffffff) != 0)) {
        do {
          if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                               container + 0x18) <
              *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                              container + 0x10) + 1U) {
            (*(code *)**(undefined8 **)
                        out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)
                      (out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
          }
          lVar6 = *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                  container + 0x10);
          *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                   0x10) = lVar6 + 1;
          *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                    container + 8) + lVar6) = (char)uVar14;
          bVar3 = 0xff < uVar14;
          uVar14 = uVar14 >> 8;
        } while (bVar3);
      }
      lVar6 = *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                              container + 0x10);
      uVar17 = lVar6 + uVar15;
      if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container
                    + 0x18) < uVar17) {
        lVar6 = 0;
      }
      else {
        *(ulong *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                  0x10) = uVar17;
        lVar6 = lVar6 + *(long *)((long)out.
                                        super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                        container + 8);
      }
      if (lVar6 != 0) {
        pcVar10 = "0123456789abcdef";
        if (pVar1 == hex_upper) {
          pcVar10 = "0123456789ABCDEF";
        }
        pcVar8 = (char *)(lVar6 + uVar15);
        wVar9 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
        do {
          pcVar8 = pcVar8 + -1;
          uVar14 = arg.abs_value;
          *pcVar8 = pcVar10[uVar14 & 0xf];
          wVar9 = (write_int_arg<unsigned_int>)((ulong)wVar9 >> 4);
          arg = wVar9;
        } while (0xf < uVar14);
        return (appender)
               out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
      }
      pcVar10 = local_68 + uVar15;
      pcVar8 = "0123456789abcdef";
      if (pVar1 == hex_upper) {
        pcVar8 = "0123456789ABCDEF";
      }
      pcVar11 = local_68 + (uVar15 - 1);
      wVar9 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
      do {
        uVar14 = arg.abs_value;
        *pcVar11 = pcVar8[uVar14 & 0xf];
        wVar9 = (write_int_arg<unsigned_int>)((ulong)wVar9 >> 4);
        pcVar11 = pcVar11 + -1;
        arg = wVar9;
      } while (0xf < uVar14);
      break;
    case bin_lower:
    case bin_upper:
      if ((specs->field_0x9 & 0x80) != 0) {
        uVar4 = (uint)(pVar1 != bin_upper) << 0xd | 0x4230;
        uVar13 = uVar4 << 8;
        if (uVar17 == 0) {
          uVar13 = uVar4;
        }
        uVar17 = (ulong)((uVar13 | uVar16) + 0x2000000);
      }
      uVar16 = 0x1f;
      if ((uVar14 | 1) != 0) {
        for (; (uVar14 | 1) >> uVar16 == 0; uVar16 = uVar16 - 1) {
        }
      }
      uVar14 = (uVar16 ^ 0xffffffe0) + 0x21;
      uVar15 = (ulong)uVar14;
      uVar16 = (uint)uVar17;
      if (specs->precision != -1 || specs->width != 0) {
        write_int_data<char>::write_int_data(&local_40,uVar14,uVar16,specs);
        local_68._8_8_ = local_40.size;
        local_68._16_8_ = local_40.padding;
        local_68._24_8_ = (ulong)arg & 0xffffffff | uVar15 << 0x20;
        local_68._0_4_ = uVar16;
        aVar5 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_int>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_3_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_int>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_3_)::_lambda(fmt::v8::appender)_1_&>
                          (out,specs,local_40.size,local_40.size,
                           (anon_class_32_3_03e05ccd *)local_68);
        return (appender)
               aVar5.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
      }
      if ((uVar16 != 0) && (uVar14 = uVar16 & 0xffffff, (uVar17 & 0xffffff) != 0)) {
        do {
          if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                               container + 0x18) <
              *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                              container + 0x10) + 1U) {
            (*(code *)**(undefined8 **)
                        out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)
                      (out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
          }
          lVar6 = *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                  container + 0x10);
          *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                   0x10) = lVar6 + 1;
          *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                    container + 8) + lVar6) = (char)uVar14;
          bVar3 = 0xff < uVar14;
          uVar14 = uVar14 >> 8;
        } while (bVar3);
      }
      lVar6 = *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                              container + 0x10);
      uVar17 = lVar6 + uVar15;
      if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container
                    + 0x18) < uVar17) {
        lVar6 = 0;
      }
      else {
        *(ulong *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                  0x10) = uVar17;
        lVar6 = lVar6 + *(long *)((long)out.
                                        super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                        container + 8);
      }
      if (lVar6 != 0) {
        pbVar7 = (byte *)(lVar6 + uVar15);
        wVar9 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
        do {
          pbVar7 = pbVar7 + -1;
          uVar14 = arg.abs_value;
          *pbVar7 = (byte)arg.abs_value & 1 | 0x30;
          wVar9 = (write_int_arg<unsigned_int>)((ulong)wVar9 >> 1);
          arg = wVar9;
        } while (1 < uVar14);
        return (appender)
               out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
      }
      pcVar10 = local_68 + uVar15;
      pbVar7 = local_68 + (uVar15 - 1);
      wVar9 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
      do {
        uVar14 = arg.abs_value;
        *pbVar7 = (byte)arg.abs_value & 1 | 0x30;
        wVar9 = (write_int_arg<unsigned_int>)((ulong)wVar9 >> 1);
        pbVar7 = pbVar7 + -1;
        arg = wVar9;
      } while (1 < uVar14);
      break;
    default:
      goto switchD_00118081_caseD_7;
    case chr:
      local_68[0] = (char)arg.abs_value;
      aVar5 = write_padded<(fmt::v8::align::type)1,fmt::v8::appender,char,fmt::v8::detail::write_char<char,fmt::v8::appender>(fmt::v8::appender,char,fmt::v8::basic_format_specs<char>const&)::_lambda(fmt::v8::appender)_1_&>
                        (out,specs,1,1,(anon_class_1_1_a8c68091 *)local_68);
      return (appender)
             aVar5.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
    }
    aVar5 = copy_str_noinline<char,char*,fmt::v8::appender>(local_68,pcVar10,out);
    return (appender)
           aVar5.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
  }
switchD_00118081_caseD_7:
  throw_format_error("invalid type specifier");
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(
    OutputIt out, write_int_arg<T> arg, const basic_format_specs<Char>& specs,
    locale_ref loc) -> OutputIt {
  return write_int(out, arg, specs, loc);
}